

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

string * __thiscall
AssemblyCode::AddRegConstCommand::ToString_abi_cxx11_
          (string *__return_storage_ptr__,AddRegConstCommand *this)

{
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  IRT::CTemp::ToString_abi_cxx11_(&local_38,&this->leftOperand);
  std::operator+(&local_98,"add ",&local_38);
  std::operator+(&local_78,&local_98," ");
  std::__cxx11::to_string(&sStack_b8,this->constant);
  std::operator+(&local_58,&local_78,&sStack_b8);
  std::operator+(__return_storage_ptr__,&local_58,"\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblyCode::AddRegConstCommand::ToString( ) const {
    return "add " + leftOperand.ToString( ) + " " + std::to_string( constant ) + "\n";
}